

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::clearBadBasisChange(HEkk *this,BadBasisChangeReason reason)

{
  double dVar1;
  undefined4 uVar2;
  bool bVar3;
  undefined3 uVar4;
  HighsInt HVar5;
  HighsInt HVar6;
  HighsInt HVar7;
  HighsSimplexBadBasisChangeRecord *pHVar8;
  const_iterator __first;
  const_iterator __last;
  long lVar9;
  HighsSimplexBadBasisChangeRecord *pHVar10;
  long lVar11;
  
  pHVar8 = (this->bad_basis_change_).
           super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->bad_basis_change_).
       super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (reason == kAll) {
    if (__last._M_current != pHVar8) {
      (this->bad_basis_change_).
      super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
      ._M_impl.super__Vector_impl_data._M_finish = pHVar8;
    }
    return;
  }
  lVar11 = (long)__last._M_current - (long)pHVar8;
  pHVar8 = pHVar8 + 2;
  for (lVar9 = lVar11 >> 7; 0 < lVar9; lVar9 = lVar9 + -1) {
    if (pHVar8[-2].reason == reason) {
      __first._M_current = pHVar8 + -2;
      goto LAB_00329f60;
    }
    if (pHVar8[-1].reason == reason) {
      __first._M_current = pHVar8 + -1;
      goto LAB_00329f60;
    }
    __first._M_current = pHVar8;
    if (pHVar8->reason == reason) goto LAB_00329f60;
    if (pHVar8[1].reason == reason) {
      __first._M_current = pHVar8 + 1;
      goto LAB_00329f60;
    }
    pHVar8 = pHVar8 + 4;
    lVar11 = lVar11 + -0x80;
  }
  lVar11 = lVar11 >> 5;
  pHVar10 = pHVar8 + -2;
  if (lVar11 == 1) {
LAB_00329fbd:
    __first._M_current = pHVar10;
    if (pHVar10->reason != reason) {
      __first._M_current = __last._M_current;
    }
  }
  else if (lVar11 == 3) {
    __first._M_current = pHVar10;
    if (pHVar8[-2].reason != reason) {
      pHVar10 = pHVar8 + -1;
      goto LAB_00329fb3;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar11 != 2) goto LAB_00329f9f;
LAB_00329fb3:
    __first._M_current = pHVar10;
    if (pHVar10->reason != reason) {
      pHVar10 = pHVar10 + 1;
      goto LAB_00329fbd;
    }
  }
LAB_00329f60:
  pHVar8 = __first._M_current;
  if (__first._M_current != __last._M_current) {
    while (pHVar10 = pHVar8, pHVar8 = pHVar10 + 1, pHVar8 != __last._M_current) {
      if (pHVar10[1].reason != reason) {
        bVar3 = pHVar8->taboo;
        uVar4 = *(undefined3 *)&pHVar8->field_0x1;
        HVar5 = pHVar8->row_out;
        HVar6 = pHVar10[1].variable_out;
        HVar7 = pHVar10[1].variable_in;
        uVar2 = *(undefined4 *)&pHVar10[1].field_0x14;
        dVar1 = pHVar10[1].save_value;
        (__first._M_current)->reason = pHVar10[1].reason;
        *(undefined4 *)&(__first._M_current)->field_0x14 = uVar2;
        (__first._M_current)->save_value = dVar1;
        (__first._M_current)->taboo = bVar3;
        *(undefined3 *)&(__first._M_current)->field_0x1 = uVar4;
        (__first._M_current)->row_out = HVar5;
        (__first._M_current)->variable_out = HVar6;
        (__first._M_current)->variable_in = HVar7;
        __first._M_current = __first._M_current + 1;
      }
    }
    __last._M_current =
         (this->bad_basis_change_).
         super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
LAB_00329f9f:
  std::vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>::
  erase(&this->bad_basis_change_,__first,__last);
  return;
}

Assistant:

void HEkk::clearBadBasisChange(const BadBasisChangeReason reason) {
  if (reason == BadBasisChangeReason::kAll) {
    bad_basis_change_.clear();
  } else {
    bad_basis_change_.erase(
        std::remove_if(
            bad_basis_change_.begin(), bad_basis_change_.end(),
            [reason](const HighsSimplexBadBasisChangeRecord& record) {
              return record.reason == reason;
            }),
        bad_basis_change_.end());
  }
}